

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

StringRef __thiscall llvm::ARM::computeDefaultTargetABI(ARM *this,Triple *TT,StringRef CPU)

{
  int iVar1;
  ArchKind AVar2;
  ProfileKind PVar3;
  uint uVar4;
  char *pcVar5;
  StringRef SVar6;
  StringRef SVar7;
  size_t sStack_20;
  
  SVar6.Length = CPU.Data;
  if (SVar6.Length == (char *)0x0) {
    SVar6 = Triple::getArchName((Triple *)this);
  }
  else {
    SVar6.Data = SVar6.Length;
    AVar2 = parseCPUArch((ARM *)TT,SVar6);
    SVar6 = *(StringRef *)(&(anonymous_namespace)::ARCHNames + (ulong)AVar2 * 8);
  }
  if (*(int *)(this + 0x34) == 3) {
    sStack_20 = 5;
    pcVar5 = "aapcs";
    if ((*(int *)(this + 0x30) != 8) && (*(int *)(this + 0x2c) != 0)) {
      PVar3 = parseArchProfile(SVar6);
      if (PVar3 != M) {
        pcVar5 = "apcs-gnu";
        if (*(int *)(this + 0x24) == 0xd) {
          pcVar5 = "aapcs16";
        }
        sStack_20 = (ulong)(*(int *)(this + 0x24) != 0xd) + 7;
      }
    }
  }
  else {
    iVar1 = *(int *)(this + 0x2c);
    sStack_20 = 5;
    pcVar5 = "aapcs";
    if (iVar1 != 0xf) {
      uVar4 = *(int *)(this + 0x30) - 4;
      if ((uVar4 < 10) && ((0x373U >> (uVar4 & 0x1f) & 1) != 0)) {
        pcVar5 = &DAT_001a4848 + *(int *)(&DAT_001a4848 + (ulong)uVar4 * 4);
        sStack_20 = *(size_t *)(&DAT_001a4870 + (ulong)uVar4 * 8);
      }
      else if (iVar1 == 0xc) {
        sStack_20 = 8;
        pcVar5 = "apcs-gnu";
      }
      else if (iVar1 == 0xd) {
        sStack_20 = 0xb;
        pcVar5 = "aapcs-linux";
      }
    }
  }
  SVar7.Length = sStack_20;
  SVar7.Data = pcVar5;
  return SVar7;
}

Assistant:

StringRef llvm::ARM::computeDefaultTargetABI(const Triple &TT, StringRef CPU) {
  StringRef ArchName =
      CPU.empty() ? TT.getArchName() : ARM::getArchName(ARM::parseCPUArch(CPU));

  if (TT.isOSBinFormatMachO()) {
    if (TT.getEnvironment() == Triple::EABI ||
        TT.getOS() == Triple::UnknownOS ||
        llvm::ARM::parseArchProfile(ArchName) == ARM::ProfileKind::M)
      return "aapcs";
    if (TT.isWatchABI())
      return "aapcs16";
    return "apcs-gnu";
  } else if (TT.isOSWindows())
    // FIXME: this is invalid for WindowsCE.
    return "aapcs";

  // Select the default based on the platform.
  switch (TT.getEnvironment()) {
  case Triple::Android:
  case Triple::GNUEABI:
  case Triple::GNUEABIHF:
  case Triple::MuslEABI:
  case Triple::MuslEABIHF:
    return "aapcs-linux";
  case Triple::EABIHF:
  case Triple::EABI:
    return "aapcs";
  default:
    if (TT.isOSNetBSD())
      return "apcs-gnu";
    if (TT.isOSOpenBSD())
      return "aapcs-linux";
    return "aapcs";
  }
}